

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O0

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_sha256,_256UL>_>::
     test_all_vectors(void)

{
  bool bVar1;
  test_vector_map_type *t;
  type input;
  byte local_49;
  pair_type *pair;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_38;
  bool _foreach_continue49;
  auto_any_base *local_30;
  auto_any_t _foreach_end49;
  auto_any_base *local_20;
  auto_any_t _foreach_cur49;
  auto_any_t local_10;
  auto_any_t _foreach_col49;
  
  t = test_vector_registry<cryptox::message_digest_algorithm<&EVP_sha256,256ul>>::
      test_vectors_abi_cxx11_();
  _foreach_cur49 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                 (t,(false_ *)0x0);
  local_10 = (auto_any_t)&_foreach_cur49;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_10);
  if (!bVar1) {
    _foreach_end49 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,mpl_::bool_<false>>
                   (local_10,(type2type<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                              *)0x0,(false_ *)0x0);
    local_20 = (auto_any_base *)&_foreach_end49;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_20);
    if (!bVar1) {
      _Stack_38._M_node =
           (_Base_ptr)
           boost::foreach_detail_::
           end<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,mpl_::bool_<false>>
                     (local_10,(type2type<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0,(false_ *)0x0);
      local_30 = (auto_any_base *)&stack0xffffffffffffffc8;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_30);
      if (!bVar1) {
        pair._7_1_ = 1;
        while( true ) {
          local_49 = 0;
          if ((pair._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,mpl_::bool_<false>>
                              (local_20,local_30,
                               (type2type<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_49 = bVar1 ^ 0xff;
          }
          if ((local_49 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&pair + 7));
          if (!bVar1) {
            input = boost::foreach_detail_::
                    deref<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,mpl_::bool_<false>>
                              (local_20,(type2type<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                                         *)0x0);
            while (((pair._7_1_ ^ 0xff) & 1) != 0) {
              test_vector(&input->first,&input->second);
              pair._7_1_ = 1;
            }
          }
          if ((pair._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,mpl_::bool_<false>>
                      (local_20,(type2type<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                                 *)0x0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void test_all_vectors() {
			// TODO: Have a warning on untested algorithms.

			typedef test_vector_map_type::value_type pair_type;
			BOOST_FOREACH(pair_type& pair, test_vectors()) {
				test_vector(pair.first, pair.second);
			}
		}